

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

String __thiscall testing::internal::String::ShowCStringQuoted(String *this,char *c_str)

{
  size_t extraout_RDX;
  String SVar2;
  size_t sVar1;
  
  if (c_str == (char *)0x0) {
    String(this,"(null)");
    sVar1 = extraout_RDX;
  }
  else {
    SVar2 = Format((char *)this,"\"%s\"",c_str);
    sVar1 = SVar2.length_;
  }
  SVar2.length_ = sVar1;
  SVar2.c_str_ = (char *)this;
  return SVar2;
}

Assistant:

String String::ShowCStringQuoted(const char* c_str) {
  return c_str ? String::Format("\"%s\"", c_str) : String("(null)");
}